

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void disas_scc(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *s_00;
  TCGTemp *a1;
  TCGv_i32 pTVar1;
  uintptr_t o;
  TCGv_i32 ret;
  DisasCompare_conflict c;
  
  s_00 = s->uc->tcg_ctx;
  gen_cc_cond(&c,s,insn >> 8 & 0xf);
  a1 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
  ret = (TCGv_i32)((long)a1 - (long)s_00);
  tcg_gen_setcond_i32_m68k(s_00,c.tcond,ret,c.v1,c.v2);
  free_cond(s_00,&c);
  tcg_gen_op2_m68k(s_00,INDEX_op_neg_i32,(TCGArg)a1,(TCGArg)a1);
  pTVar1 = gen_ea_mode(env,s,insn >> 3 & 7,insn & 7,0,ret,(TCGv_i32 *)0x0,EA_STORE,
                       (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  if (pTVar1 != s_00->NULL_QREG) {
    tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(ret + (long)s_00));
    return;
  }
  gen_exception(s,(s->base).pc_next,3);
  return;
}

Assistant:

DISAS_INSN(scc)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    DisasCompare c;
    int cond;
    TCGv tmp;

    cond = (insn >> 8) & 0xf;
    gen_cc_cond(&c, s, cond);

    tmp = tcg_temp_new(tcg_ctx);
    tcg_gen_setcond_i32(tcg_ctx, c.tcond, tmp, c.v1, c.v2);
    free_cond(tcg_ctx, &c);

    tcg_gen_neg_i32(tcg_ctx, tmp, tmp);
    DEST_EA(env, insn, OS_BYTE, tmp, NULL);
    tcg_temp_free(tcg_ctx, tmp);
}